

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder capnp::DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Builder *builder)

{
  uchar *puVar1;
  char *pcVar2;
  Builder BVar3;
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Fault f;
  
  if (builder->type == TEXT) {
    puVar1 = (uchar *)(builder->field_1).textValue.content.ptr;
    pcVar2 = (char *)((builder->field_1).textValue.content.size_ - 1);
  }
  else {
    _kjCondition.right = DATA;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = builder->type == DATA;
    if (_kjCondition.result) {
      puVar1 = (uchar *)(builder->field_1).intValue;
      pcVar2 = (builder->field_1).textValue.content.ptr;
    }
    else {
      pcVar2 = (char *)0x0;
      _kjCondition.left = &builder->type;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[21]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x755,FAILED,"builder.type == DATA","_kjCondition,\"Value type mismatch.\"",
                 &_kjCondition,(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::~Fault(&f);
      puVar1 = (uchar *)0x0;
    }
  }
  BVar3.super_ArrayPtr<unsigned_char>.size_ = (size_t)pcVar2;
  BVar3.super_ArrayPtr<unsigned_char>.ptr = puVar1;
  return (Builder)BVar3.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder DynamicValue::Builder::AsImpl<Data>::apply(Builder& builder) {
  if (builder.type == TEXT) {
    // Coerce text to data.
    return builder.textValue.asBytes();
  }
  KJ_REQUIRE(builder.type == DATA, "Value type mismatch.") {
    return BuilderFor<Data>();
  }
  return builder.dataValue;
}